

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

rnnvarset * copyvarset(rnnvarset *varset)

{
  rnnenum *prVar1;
  int *piVar2;
  rnnvarset *prVar3;
  int *piVar4;
  long lVar5;
  size_t __size;
  
  prVar3 = (rnnvarset *)calloc(0x10,1);
  prVar1 = varset->venum;
  prVar3->venum = prVar1;
  __size = (size_t)prVar1->valsnum;
  piVar4 = (int *)calloc(4,__size);
  prVar3->variants = piVar4;
  if (0 < (long)__size) {
    piVar2 = varset->variants;
    lVar5 = 0;
    do {
      piVar4[lVar5] = piVar2[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 < (long)__size);
  }
  return prVar3;
}

Assistant:

static struct rnnvarset *copyvarset (struct rnnvarset *varset) {
	struct rnnvarset *res = calloc(sizeof *res, 1);
	res->venum = varset->venum;
	res->variants = calloc(sizeof *res->variants, res->venum->valsnum);
	int i;
	for (i = 0; i < res->venum->valsnum; i++)
		res->variants[i] = varset->variants[i];
	return res;
}